

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocketContextData.h
# Opt level: O3

void __thiscall
uWS::WebSocketContextData<false>::~WebSocketContextData(WebSocketContextData<false> *this)

{
  Loop *pLVar1;
  
  pLVar1 = Loop::get((void *)0x0);
  Loop::removePostHandler(pLVar1,this);
  pLVar1 = Loop::get((void *)0x0);
  Loop::removePreHandler(pLVar1,this);
  TopicTree::~TopicTree(&this->topicTree);
  (*(this->pongHandler).erasure_.vtable_.cmd_)
            (&(this->pongHandler).erasure_.vtable_,op_weak_destroy,
             (data_accessor *)&this->pongHandler,0x10,(data_accessor *)0x0,0);
  (*(this->pingHandler).erasure_.vtable_.cmd_)
            (&(this->pingHandler).erasure_.vtable_,op_weak_destroy,
             (data_accessor *)&this->pingHandler,0x10,(data_accessor *)0x0,0);
  (*(this->closeHandler).erasure_.vtable_.cmd_)
            (&(this->closeHandler).erasure_.vtable_,op_weak_destroy,
             (data_accessor *)&this->closeHandler,0x10,(data_accessor *)0x0,0);
  (*(this->drainHandler).erasure_.vtable_.cmd_)
            (&(this->drainHandler).erasure_.vtable_,op_weak_destroy,
             (data_accessor *)&this->drainHandler,0x10,(data_accessor *)0x0,0);
  (*(this->messageHandler).erasure_.vtable_.cmd_)
            (&(this->messageHandler).erasure_.vtable_,op_weak_destroy,(data_accessor *)this,0x10,
             (data_accessor *)0x0,0);
  return;
}

Assistant:

~WebSocketContextData() {
        /* We must unregister any loop post handler here */
        Loop::get()->removePostHandler(this);
        Loop::get()->removePreHandler(this);
    }